

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O3

bool __thiscall
libcellml::Importer::ImporterImpl::fetchModel
          (ImporterImpl *this,ImportSourcePtr *importSource,string *baseFile)

{
  ImportLibrary *this_00;
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  IssueImpl *pIVar3;
  _func_int **input;
  StrictImpl *this_01;
  bool bVar4;
  ReferenceRule RVar5;
  const_iterator cVar6;
  mapped_type *pmVar7;
  long *plVar8;
  size_t sVar9;
  size_type *psVar10;
  Issue *pIVar11;
  size_t sVar12;
  IssuePtr issue;
  IssuePtr issue_2;
  ParserPtr parser;
  string url;
  stringstream buffer;
  ifstream file;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::Model>_>
  local_478;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_448;
  Logger local_420;
  ImportSourcePtr *local_410;
  Parser local_408;
  string local_3e0;
  undefined1 local_3c0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3b0 [7];
  ios_base local_340 [264];
  undefined1 local_238 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228;
  int aiStack_218 [122];
  
  local_410 = importSource;
  ImportSource::url_abi_cxx11_
            ((string *)local_238,
             (importSource->super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>)
             ._M_ptr);
  normaliseDirectorySeparator(&local_3e0,(string *)local_238);
  if ((undefined1 *)local_238._0_8_ != local_238 + 0x10) {
    operator_delete((void *)local_238._0_8_,local_228._M_allocated_capacity + 1);
  }
  this_00 = &this->mLibrary;
  cVar6 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::Model>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::Model>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::Model>_>_>_>
          ::find(&this_00->_M_t,&local_3e0);
  p_Var1 = &(this->mLibrary)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)cVar6._M_node == p_Var1) {
    resolvePath((string *)local_238,&local_3e0,baseFile);
    std::__cxx11::string::operator=((string *)&local_3e0,(string *)local_238);
    if ((undefined1 *)local_238._0_8_ != local_238 + 0x10) {
      operator_delete((void *)local_238._0_8_,local_228._M_allocated_capacity + 1);
    }
  }
  local_408.super_Strict._vptr_Strict = (_func_int **)0x0;
  local_408.super_Strict.mPimpl = (StrictImpl *)0x0;
  cVar6 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::Model>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::Model>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::Model>_>_>_>
          ::find(&this_00->_M_t,&local_3e0);
  if ((_Rb_tree_header *)cVar6._M_node == p_Var1) {
    std::ifstream::ifstream(local_238,(string *)&local_3e0,_S_in);
    if (*(int *)((long)aiStack_218 + *(long *)(local_238._0_8_ + -0x18)) != 0) {
      Issue::IssueImpl::create();
      pIVar3 = *(IssueImpl **)(local_448._M_dataplus._M_p + 8);
      std::operator+(&local_478.first,"The attempt to resolve imports with the model at \'",
                     &local_3e0);
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_478);
      psVar10 = (size_type *)(plVar8 + 2);
      if ((size_type *)*plVar8 == psVar10) {
        local_3b0[0]._0_8_ = *psVar10;
        local_3b0[0]._8_8_ = plVar8[3];
        local_3c0._0_8_ = local_3c0 + 0x10;
      }
      else {
        local_3b0[0]._0_8_ = *psVar10;
        local_3c0._0_8_ = (size_type *)*plVar8;
      }
      local_3c0._8_8_ = plVar8[1];
      *plVar8 = (long)psVar10;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      Issue::IssueImpl::setDescription(pIVar3,(string *)local_3c0);
      if ((undefined1 *)local_3c0._0_8_ != local_3c0 + 0x10) {
        operator_delete((void *)local_3c0._0_8_,local_3b0[0]._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_478.first._M_dataplus._M_p != &local_478.first.field_2) {
        operator_delete(local_478.first._M_dataplus._M_p,
                        local_478.first.field_2._M_allocated_capacity + 1);
      }
      AnyCellmlElement::AnyCellmlElementImpl::setImportSource
                (*(AnyCellmlElementImpl **)
                  (*(EntityImpl **)(local_448._M_dataplus._M_p + 8))[1].mId._M_string_length,
                 local_410);
      Issue::IssueImpl::setReferenceRule
                (*(IssueImpl **)(local_448._M_dataplus._M_p + 8),IMPORTER_MISSING_FILE);
      Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,(IssuePtr *)&local_448);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_448._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_448._M_string_length);
      }
LAB_0021d9a5:
      std::ifstream::~ifstream(local_238);
      bVar4 = false;
      goto LAB_0021d9b4;
    }
    std::__cxx11::stringstream::stringstream((stringstream *)local_3c0);
    std::ostream::operator<<((ostream *)(local_3c0 + 0x10),(streambuf *)(local_238 + 0x10));
    bVar4 = Strict::isStrict(&this->mImporter->super_Strict);
    Parser::create(&local_408,bVar4);
    input = local_408.super_Logger._vptr_Logger;
    std::__cxx11::stringbuf::str();
    Parser::parseModel((Parser *)&local_448,(string *)input);
    this_01 = local_408.super_Strict.mPimpl;
    local_408.super_Strict.mPimpl = (StrictImpl *)local_448._M_string_length;
    local_408.super_Strict._vptr_Strict = (_func_int **)local_448._M_dataplus._M_p;
    local_448._M_dataplus._M_p = (pointer)0x0;
    local_448._M_string_length = 0;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01 !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_448._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_448._M_string_length);
      }
    }
    paVar2 = &local_478.first.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_478.first._M_dataplus._M_p != paVar2) {
      operator_delete(local_478.first._M_dataplus._M_p,
                      local_478.first.field_2._M_allocated_capacity + 1);
    }
    bVar4 = Strict::isStrict(&this->mImporter->super_Strict);
    if (!bVar4) {
      sVar9 = Logger::messageCount((Logger *)local_408.super_Logger._vptr_Logger);
      if (sVar9 != 0) {
        Issue::IssueImpl::create();
        pIVar3 = *(IssueImpl **)(local_448._M_dataplus._M_p + 8);
        Logger::message(&local_420,(size_t)local_408.super_Logger._vptr_Logger);
        Issue::description_abi_cxx11_(&local_478.first,(Issue *)local_420._vptr_Logger);
        Issue::IssueImpl::setDescription(pIVar3,&local_478.first);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_478.first._M_dataplus._M_p != paVar2) {
          operator_delete(local_478.first._M_dataplus._M_p,
                          local_478.first.field_2._M_allocated_capacity + 1);
        }
        if (local_420.mPimpl != (LoggerImpl *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_420.mPimpl);
        }
        Issue::IssueImpl::setLevel(*(IssueImpl **)(local_448._M_dataplus._M_p + 8),MESSAGE);
        AnyCellmlElement::AnyCellmlElementImpl::setImportSource
                  (*(AnyCellmlElementImpl **)
                    (*(EntityImpl **)(local_448._M_dataplus._M_p + 8))[1].mId._M_string_length,
                   local_410);
        Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,(IssuePtr *)&local_448);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_448._M_string_length !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_448._M_string_length);
        }
      }
    }
    sVar9 = Logger::errorCount((Logger *)local_408.super_Logger._vptr_Logger);
    if (sVar9 != 0) {
      sVar12 = 0;
      do {
        Logger::error((Logger *)&local_478,(size_t)local_408.super_Logger._vptr_Logger);
        RVar5 = Issue::referenceRule((Issue *)local_478.first._M_dataplus._M_p);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_478.first._M_string_length !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_478.first._M_string_length);
        }
        if (RVar5 == XML) {
          Issue::IssueImpl::create();
          pIVar3 = *(IssueImpl **)((long)local_420._vptr_Logger + 8);
          std::operator+(&local_448,"The attempt to import the model at \'",&local_3e0);
          paVar2 = &local_478.first.field_2;
          plVar8 = (long *)std::__cxx11::string::append((char *)&local_448);
          pIVar11 = (Issue *)(plVar8 + 2);
          if ((Issue *)*plVar8 == pIVar11) {
            local_478.first.field_2._M_allocated_capacity = (size_type)pIVar11->_vptr_Issue;
            local_478.first.field_2._8_8_ = plVar8[3];
            local_478.first._M_dataplus._M_p = (pointer)paVar2;
          }
          else {
            local_478.first.field_2._M_allocated_capacity = (size_type)pIVar11->_vptr_Issue;
            local_478.first._M_dataplus._M_p = (pointer)*plVar8;
          }
          local_478.first._M_string_length = plVar8[1];
          *plVar8 = (long)pIVar11;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          Issue::IssueImpl::setDescription(pIVar3,&local_478.first);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_478.first._M_dataplus._M_p != paVar2) {
            operator_delete(local_478.first._M_dataplus._M_p,
                            local_478.first.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_448._M_dataplus._M_p != &local_448.field_2) {
            operator_delete(local_448._M_dataplus._M_p,local_448.field_2._M_allocated_capacity + 1);
          }
          AnyCellmlElement::AnyCellmlElementImpl::setImportSource
                    ((((*(IssueImpl **)((long)local_420._vptr_Logger + 8))->mItem).
                      super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->mPimpl,local_410);
          bVar4 = Strict::isStrict(&this->mImporter->super_Strict);
          if (bVar4) {
            Issue::IssueImpl::setReferenceRule
                      (*(IssueImpl **)((long)local_420._vptr_Logger + 8),IMPORTER_NULL_MODEL);
          }
          Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,(IssuePtr *)&local_420);
          if (local_420.mPimpl != (LoggerImpl *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_420.mPimpl);
          }
          if (local_408.super_Logger.mPimpl != (LoggerImpl *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_408.super_Logger.mPimpl
                      );
          }
          std::__cxx11::stringstream::~stringstream((stringstream *)local_3c0);
          std::ios_base::~ios_base(local_340);
          goto LAB_0021d9a5;
        }
        Logger::error((Logger *)&local_478,(size_t)local_408.super_Logger._vptr_Logger);
        Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,(IssuePtr *)&local_478);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_478.first._M_string_length !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_478.first._M_string_length);
        }
        sVar12 = sVar12 + 1;
      } while (sVar9 != sVar12);
    }
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::Model>_>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::shared_ptr<libcellml::Model>_&,_true>
              (&local_478,&local_3e0,(shared_ptr<libcellml::Model> *)&local_408.super_Strict);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<libcellml::Model>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<libcellml::Model>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<libcellml::Model>>>>
    ::_M_emplace_unique<std::pair<std::__cxx11::string,std::shared_ptr<libcellml::Model>>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<libcellml::Model>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<libcellml::Model>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<libcellml::Model>>>>
                *)this_00,&local_478);
    if (local_478.second.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_478.second.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_478.first._M_dataplus._M_p != &local_478.first.field_2) {
      operator_delete(local_478.first._M_dataplus._M_p,
                      local_478.first.field_2._M_allocated_capacity + 1);
    }
    if (local_408.super_Logger.mPimpl != (LoggerImpl *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_408.super_Logger.mPimpl);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_3c0);
    std::ios_base::~ios_base(local_340);
    std::ifstream::~ifstream(local_238);
  }
  else {
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::Model>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::Model>_>_>_>
             ::operator[](this_00,&local_3e0);
    local_408.super_Strict._vptr_Strict =
         (_func_int **)
         (pmVar7->super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_408.super_Strict.mPimpl,
               &(pmVar7->super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount);
  }
  bVar4 = true;
  ImportSource::setModel
            ((local_410->super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr,(ModelPtr *)&local_408.super_Strict);
LAB_0021d9b4:
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_408.super_Strict.mPimpl !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_408.super_Strict.mPimpl);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
    operator_delete(local_3e0._M_dataplus._M_p,local_3e0.field_2._M_allocated_capacity + 1);
  }
  return bVar4;
}

Assistant:

bool Importer::ImporterImpl::fetchModel(const ImportSourcePtr &importSource, const std::string &baseFile)
{
    std::string url = normaliseDirectorySeparator(importSource->url());
    if (mLibrary.count(url) == 0) {
        url = resolvePath(url, baseFile);
    }

    ModelPtr model;
    if (mLibrary.count(url) == 0) {
        // If the URL has not ever been resolved into a model in this library, with or
        // without baseFile, parse it and save.
        std::ifstream file(url);
        if (!file.good()) {
            auto issue = Issue::IssueImpl::create();
            issue->mPimpl->setDescription("The attempt to resolve imports with the model at '" + url + "' failed: the file could not be opened.");
            issue->mPimpl->mItem->mPimpl->setImportSource(importSource);
            issue->mPimpl->setReferenceRule(Issue::ReferenceRule::IMPORTER_MISSING_FILE);
            addIssue(issue);
            return false;
        }
        std::stringstream buffer;
        buffer << file.rdbuf();
        auto parser = Parser::create(mImporter->isStrict());
        model = parser->parseModel(buffer.str());
        if (!mImporter->isStrict() && (parser->messageCount() > 0)) {
            auto issue = Issue::IssueImpl::create();
            issue->mPimpl->setDescription(parser->message(0)->description());
            issue->mPimpl->setLevel(Issue::Level::MESSAGE);
            issue->mPimpl->mItem->mPimpl->setImportSource(importSource);
            addIssue(issue);
        }
        auto errorCount = parser->errorCount();
        if (errorCount > 0) {
            for (size_t index = 0; index < errorCount; ++index) {
                if (parser->error(index)->referenceRule() == Issue::ReferenceRule::XML) {
                    auto issue = Issue::IssueImpl::create();
                    issue->mPimpl->setDescription("The attempt to import the model at '" + url + "' failed: the file is not valid XML.");
                    issue->mPimpl->mItem->mPimpl->setImportSource(importSource);
                    if (mImporter->isStrict()) {
                        issue->mPimpl->setReferenceRule(Issue::ReferenceRule::IMPORTER_NULL_MODEL);
                    }
                    addIssue(issue);
                    return false;
                }
                addIssue(parser->error(index));
            }
        }
        mLibrary.insert(std::make_pair(url, model));
    } else {
        model = mLibrary[url];
    }
    importSource->setModel(model);
    return true;
}